

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void kratos::Var::move_src_to(Var *var,Var *new_var,Generator *parent,bool keep_connection)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  int iVar2;
  int iVar3;
  VarException *this;
  undefined4 extraout_var;
  Generator *pGVar4;
  element_type *stmt_00;
  Var **ppVVar5;
  Var *pVVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  element_type *peVar7;
  pair<const_char_*,_int> pVar8;
  shared_ptr<kratos::Stmt> local_140;
  char *local_130;
  int local_128;
  int local_11c;
  pair<const_char_*,_int> local_118;
  enable_shared_from_this<kratos::Var> local_108;
  undefined1 local_f8 [8];
  shared_ptr<kratos::AssignStmt> stmt_1;
  int local_d4;
  pair<const_char_*,_int> local_d0;
  undefined1 local_c0 [8];
  value_type *stmt;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range1;
  undefined1 local_98 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_88;
  size_type local_80;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  Generator *pGStack_20;
  bool keep_connection_local;
  Generator *parent_local;
  Var *new_var_local;
  Var *var_local;
  
  local_21 = keep_connection;
  pGStack_20 = parent;
  parent_local = (Generator *)new_var;
  new_var_local = var;
  if ((var->type_ != Expression) && (var->type_ != ConstValue)) {
    iVar2 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
    __end1 = std::
             unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    stmt = (value_type *)
           std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                  *)CONCAT44(extraout_var,iVar2));
    while (bVar1 = std::__detail::operator!=
                             (&__end1.
                               super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                              ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)
                               &stmt), bVar1) {
      local_c0 = (undefined1  [8])
                 std::__detail::
                 _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                           (&__end1);
      peVar7 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c0);
      pGVar4 = Stmt::generator_parent(&peVar7->super_Stmt);
      if (pGVar4 == pGStack_20) {
        stmt_00 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                             local_c0);
        stmt_set_left(stmt_00,new_var_local,(Var *)parent_local);
        if ((pGStack_20->debug & 1U) != 0) {
          peVar7 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c0);
          local_d4 = 0x658;
          pVar8 = std::make_pair<char_const(&)[77],int>
                            ((char (*) [77])
                             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/expr.cc"
                             ,&local_d4);
          stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar8.first;
          local_d0.second = pVar8.second;
          local_d0.first =
               (char *)stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(peVar7->super_Stmt).super_IRNode.fn_name_ln,&local_d0);
        }
        (*(parent_local->super_IRNode)._vptr_IRNode[0x16])(parent_local,local_c0);
        peVar7 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c0);
        ppVVar5 = AssignStmt::right(peVar7);
        bVar1 = parametrized(*ppVVar5);
        if ((bVar1) && (bVar1 = parametrized((Var *)parent_local), !bVar1)) {
          peVar7 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c0);
          ppVVar5 = AssignStmt::right(peVar7);
          pVVar6 = width_param(*ppVVar5);
          iVar2 = (*(pVVar6->super_IRNode)._vptr_IRNode[0xd])();
          iVar3 = (*(parent_local->super_IRNode)._vptr_IRNode[0xd])();
          pGVar4 = parent_local;
          if (CONCAT44(extraout_var_00,iVar2) == CONCAT44(extraout_var_01,iVar3)) {
            peVar7 = std::
                     __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_c0);
            ppVVar5 = AssignStmt::right(peVar7);
            pVVar6 = width_param(*ppVVar5);
            (*(pGVar4->super_IRNode)._vptr_IRNode[0x23])(pGVar4,pVVar6);
          }
        }
      }
      std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
      operator++(&__end1);
    }
    (*(new_var_local->super_IRNode)._vptr_IRNode[0x12])(new_var_local,0);
    pVVar6 = new_var_local;
    if ((local_21 & 1) != 0) {
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_108);
      assign((Var *)local_f8,(shared_ptr<kratos::Var> *)pVVar6);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_108);
      if ((pGStack_20->debug & 1U) != 0) {
        peVar7 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_f8);
        local_11c = 0x668;
        pVar8 = std::make_pair<char_const(&)[77],int>
                          ((char (*) [77])
                           "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/expr.cc"
                           ,&local_11c);
        local_130 = pVar8.first;
        local_128 = pVar8.second;
        local_118.first = local_130;
        local_118.second = local_128;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&(peVar7->super_Stmt).super_IRNode.fn_name_ln,&local_118);
      }
      pGVar4 = pGStack_20;
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                (&local_140,(shared_ptr<kratos::AssignStmt> *)local_f8);
      Generator::add_stmt(pGVar4,&local_140);
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_140);
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_f8);
    }
    return;
  }
  __range1._6_1_ = 1;
  this = (VarException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Only base or port variables are allowed.",&local_49);
  local_98._0_8_ = new_var_local;
  local_98._8_8_ = parent_local;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98;
  local_80 = 2;
  std::allocator<const_kratos::IRNode_*>::allocator
            ((allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
  __l._M_len = local_80;
  __l._M_array = (iterator)local_88._M_pi;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_78,__l,(allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
  VarException::VarException(this,&local_48,&local_78);
  __range1._6_1_ = 0;
  __cxa_throw(this,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

void Var::move_src_to(Var *var, Var *new_var, Generator *parent, bool keep_connection) {
    // only base and port vars are allowed
    if (var->type_ == VarType::Expression || var->type_ == VarType::ConstValue)
        throw VarException("Only base or port variables are allowed.", {var, new_var});

    for (const auto &stmt : var->sources()) {
        if (stmt->generator_parent() != parent) continue;
        stmt_set_left(stmt.get(), var, new_var);
        if (parent->debug) {
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
        new_var->add_source(stmt);
        // pick a source parameter, if any. only if the generator match
        if (stmt->right()->parametrized() && !new_var->parametrized() &&
            stmt->right()->width_param()->generator() == new_var->generator()) {
            new_var->set_width_param(stmt->right()->width_param());
        }
    }
    // now clear the sources
    var->clear_sources(false);

    if (keep_connection) {
        // create an assignment and add it to the parent
        auto stmt = var->assign(new_var->shared_from_this());
        if (parent->debug) {
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
        parent->add_stmt(stmt);
    }
}